

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov1Detection::forward_inplace(Yolov1Detection *this,Mat *bottom_top_blob,Option *opt)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  int *piVar10;
  float *pfVar11;
  int iVar12;
  float *pfVar13;
  long lVar14;
  int j;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  ObjectsManager objects;
  Mat local_70;
  
  iVar9 = this->side * this->side;
  iVar5 = this->box_num;
  if (bottom_top_blob->w < (iVar5 * 5 + this->classes) * iVar9) {
    iVar5 = -1;
  }
  else {
    if (this->softmax_enable != 0) {
      objects.object_boxs_table.
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)bottom_top_blob->data;
      objects.object_boxs_table.
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bottom_top_blob->elemsize;
      objects.prob_steps._0_4_ = bottom_top_blob->elempack;
      objects.step = (size_t)bottom_top_blob->allocator;
      objects.object_boxs_table.
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      Mat::reshape(&local_70,(Mat *)&objects,this->classes,iVar9,(Allocator *)0x0);
      Mat::~Mat(&local_70);
      (*this->softmax->_vptr_Layer[9])(this->softmax,&objects,opt);
      Mat::~Mat((Mat *)&objects);
      iVar5 = this->box_num;
    }
    ObjectsManager::ObjectsManager(&objects,(long)((iVar5 * iVar9) / 0x14));
    pvVar8 = bottom_top_blob->data;
    iVar5 = this->classes;
    iVar12 = this->box_num;
    pfVar11 = (float *)((long)pvVar8 + (long)(iVar5 * iVar9) * 4);
    pfVar13 = pfVar11 + iVar12 * iVar9;
    for (iVar7 = 0; iVar7 != iVar9; iVar7 = iVar7 + 1) {
      iVar2 = this->side;
      for (iVar6 = 0; iVar6 < iVar12; iVar6 = iVar6 + 1) {
        uVar4 = (uint)(this->sqrt_enable == 0);
        uVar1 = *(ulong *)(pfVar13 + 2);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar1;
        auVar23._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
        auVar23._8_8_ = 0;
        fVar22 = SUB164(~auVar23 & auVar21,0) * (float)uVar1 + (float)(auVar23._0_8_ & uVar1);
        fVar24 = SUB164(~auVar23 & auVar21,4) * (float)(uVar1 >> 0x20) +
                 (float)((auVar23._0_8_ & uVar1) >> 0x20);
        fVar20 = 1.0 / (float)this->side;
        fVar17 = fVar22 * -0.5 + fVar20 * ((float)*(undefined8 *)pfVar13 + (float)(iVar7 % iVar2));
        fVar19 = fVar24 * -0.5 +
                 fVar20 * ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) + (float)(iVar7 / iVar2));
        pfVar13 = pfVar13 + 4;
        fVar20 = *pfVar11;
        pfVar11 = pfVar11 + 1;
        for (lVar15 = 0; lVar15 < iVar5; lVar15 = lVar15 + 1) {
          fVar18 = *(float *)((long)pvVar8 + lVar15 * 4) * fVar20;
          if (this->confidence_threshold <= fVar18 && fVar18 != this->confidence_threshold) {
            detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fVar19,fVar17);
            detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(fVar24 + fVar19,fVar22 + fVar17);
            detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44((int)lVar15,fVar18);
            ObjectsManager::add_new_object_box(&objects,(ObjectBox *)&detected_objects);
            iVar5 = this->classes;
          }
        }
        iVar12 = this->box_num;
      }
      pvVar8 = (void *)((long)pvVar8 + (long)iVar5 * 4);
    }
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ObjectsManager::do_objects_nms
              (&objects,&detected_objects,this->nms_threshold,this->confidence_threshold);
    Mat::create(bottom_top_blob,6,
                (int)(((long)detected_objects.
                             super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)detected_objects.
                            super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x18),4,opt->blob_allocator)
    ;
    pvVar8 = bottom_top_blob->data;
    iVar5 = -100;
    if ((pvVar8 != (void *)0x0) && ((long)bottom_top_blob->c * bottom_top_blob->cstep != 0)) {
      lVar15 = ((long)detected_objects.
                      super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)detected_objects.
                     super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      iVar9 = bottom_top_blob->w;
      sVar3 = bottom_top_blob->elemsize;
      piVar10 = &(detected_objects.
                  super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                  super__Vector_impl_data._M_start)->classid;
      iVar5 = 0;
      iVar12 = 0;
      while (bVar16 = lVar15 != 0, lVar15 = lVar15 + -1, bVar16) {
        lVar14 = sVar3 * (long)iVar12;
        *(float *)((long)pvVar8 + lVar14) = (float)(*piVar10 + 1);
        *(int *)((long)pvVar8 + lVar14 + 4) = piVar10[-1];
        *(float *)((long)pvVar8 + lVar14 + 8) = ((ObjectBox *)(piVar10 + -5))->xmin;
        *(int *)((long)pvVar8 + lVar14 + 0xc) = piVar10[-4];
        *(int *)((long)pvVar8 + lVar14 + 0x10) = piVar10[-3];
        *(int *)((long)pvVar8 + lVar14 + 0x14) = piVar10[-2];
        piVar10 = piVar10 + 6;
        iVar12 = iVar12 + iVar9;
      }
    }
    std::_Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::~_Vector_base
              (&detected_objects.
                super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>);
    ObjectsManager::~ObjectsManager(&objects);
  }
  return iVar5;
}

Assistant:

int Yolov1Detection::forward_inplace(Mat &bottom_top_blob, const Option &opt) const
{
    int size = side * side;
    int map_total = size * (box_num * 5 + classes);
    if (bottom_top_blob.w < map_total)
        return -1;

    if (softmax_enable)
    {
        Mat classes_scores = bottom_top_blob.range(0, size * classes);
        classes_scores.reshape(classes, size);
        softmax->forward_inplace(classes_scores, opt);
    }

    ObjectsManager objects(size * box_num / 20);
    const float *classes_ptr = bottom_top_blob;
    const float *scales_ptr = classes_ptr + size * classes;
    const float *boxes_ptr = scales_ptr + size * box_num;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        int x_offset = i % side;
        int y_offset = i / side;

        for (int n = 0; n < box_num; n++)
        {

            float w = (sqrt_enable == 0) * boxes_ptr[2] + (sqrt_enable != 0) * boxes_ptr[2] * boxes_ptr[2];
            float h = (sqrt_enable == 0) * boxes_ptr[3] + (sqrt_enable != 0) * boxes_ptr[3] * boxes_ptr[3];
            float xmin = (boxes_ptr[0] + x_offset) / side - w * 0.5f;
            float ymin = (boxes_ptr[1] + y_offset) / side - h * 0.5f;
            float xmax = xmin + w;
            float ymax = ymin + h;
            boxes_ptr += 4;

            float scale = scales_ptr[0];
            scales_ptr++;

            for (int j = 0; j < classes; j++)
            {
                float prob = scale * classes_ptr[j];
                if (prob > confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = j,
                    };
                    objects.add_new_object_box(object);
                }
            }
        }

        classes_ptr += classes;
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    bottom_top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);
    if (bottom_top_blob.empty())
        return -100;

    for (size_t i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = bottom_top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}